

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection_internal.h
# Opt level: O0

void __thiscall
google::protobuf::internal::RepeatedPtrFieldStringAccessor::Swap
          (RepeatedPtrFieldStringAccessor *this,Field *data,RepeatedFieldAccessor *other_mutator,
          Field *other_data)

{
  Rep *data_00;
  int iVar1;
  RepeatedFieldType *pRVar2;
  RepeatedFieldType *other;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value;
  int local_80;
  int i_1;
  int size;
  int local_54;
  int local_50;
  int i;
  int other_size;
  undefined1 local_40 [8];
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  tmp;
  Field *other_data_local;
  RepeatedFieldAccessor *other_mutator_local;
  Field *data_local;
  RepeatedPtrFieldStringAccessor *this_local;
  
  tmp.super_RepeatedPtrFieldBase.rep_ = (Rep *)other_data;
  if ((RepeatedFieldAccessor *)this == other_mutator) {
    pRVar2 = RepeatedPtrFieldWrapper<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::MutableRepeatedField(data);
    other = RepeatedPtrFieldWrapper<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::MutableRepeatedField(tmp.super_RepeatedPtrFieldBase.rep_);
    RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::Swap(pRVar2,other);
  }
  else {
    RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::RepeatedPtrField((RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)local_40);
    pRVar2 = RepeatedPtrFieldWrapper<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::MutableRepeatedField(data);
    RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::Swap((RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)local_40,pRVar2);
    local_50 = (*other_mutator->_vptr_RepeatedFieldAccessor[3])
                         (other_mutator,tmp.super_RepeatedPtrFieldBase.rep_);
    for (local_54 = 0; local_54 < local_50; local_54 = local_54 + 1) {
      RepeatedFieldAccessor::Get<std::__cxx11::string>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&i_1,
                 other_mutator,tmp.super_RepeatedPtrFieldBase.rep_,local_54);
      RepeatedFieldAccessor::Add<std::__cxx11::string,std::__cxx11::string>
                ((RepeatedFieldAccessor *)this,data,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&i_1);
      std::__cxx11::string::~string((string *)&i_1);
    }
    iVar1 = (*(this->
              super_RepeatedPtrFieldWrapper<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ).super_RandomAccessRepeatedFieldAccessor.super_RepeatedFieldAccessor.
              _vptr_RepeatedFieldAccessor[3])(this,data);
    (*other_mutator->_vptr_RepeatedFieldAccessor[5])
              (other_mutator,tmp.super_RepeatedPtrFieldBase.rep_);
    for (local_80 = 0; data_00 = tmp.super_RepeatedPtrFieldBase.rep_, local_80 < iVar1;
        local_80 = local_80 + 1) {
      value = RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::Get((RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)local_40,local_80);
      RepeatedFieldAccessor::Add<std::__cxx11::string,std::__cxx11::string>
                (other_mutator,data_00,value);
    }
    RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~RepeatedPtrField((RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)local_40);
  }
  return;
}

Assistant:

virtual void Swap(
      Field* data,
      const internal::RepeatedFieldAccessor* other_mutator,
      Field* other_data) const {
    if (this == other_mutator) {
      MutableRepeatedField(data)->Swap(MutableRepeatedField(other_data));
    } else {
      RepeatedPtrField<string> tmp;
      tmp.Swap(MutableRepeatedField(data));
      int other_size = other_mutator->Size(other_data);
      for (int i = 0; i < other_size; ++i) {
        Add<string>(data, other_mutator->Get<string>(other_data, i));
      }
      int size = Size(data);
      other_mutator->Clear(other_data);
      for (int i = 0; i < size; ++i) {
        other_mutator->Add<string>(other_data, tmp.Get(i));
      }
    }
  }